

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

bool __thiscall soplex::SPxSolverBase<double>::noViols(SPxSolverBase<double> *this,double tol)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = (this->thecovectors->set).thenum;
  if (this->theType == ENTER) {
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        dVar1 = (this->theFvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4];
        if (tol < dVar1 - (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar4]) {
          return false;
        }
        if (tol < (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar4] - dVar1) {
          return false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
  }
  else {
    if (0 < (int)uVar2) {
      uVar4 = 0;
      do {
        dVar1 = (this->theCoPvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar4];
        if (tol < dVar1 - (this->theCoUbound->val).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]) {
          return false;
        }
        if (tol < (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar4] - dVar1) {
          return false;
        }
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    lVar3 = (long)(this->thevectors->set).thenum;
    if (0 < lVar3) {
      lVar5 = 0;
      do {
        dVar1 = (this->thePvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar5];
        if ((tol < dVar1 - (this->theUbound->val).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5]) ||
           (tol < (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar5] - dVar1)) {
          return false;
        }
        lVar5 = lVar5 + 1;
      } while (lVar3 != lVar5);
    }
  }
  return true;
}

Assistant:

bool SPxSolverBase<R>::noViols(R tol) const
   {
      assert(tol >= R(0.0));

      if(type() == ENTER)
      {
         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] - theUBbound[i] > tol)
               return false;

            if(theLBbound[i] - (*theFvec)[i] > tol)
               return false;
         }
      }
      else
      {
         assert(type() == LEAVE);

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] - (*theCoUbound)[i] > tol)
               return false;

            if((*theCoLbound)[i] - (*theCoPvec)[i] > tol)
               return false;
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] - (*theUbound)[i] > tol)
               return false;

            if((*theLbound)[i] - (*thePvec)[i] > tol)
               return false;
         }
      }

      return true;
   }